

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextLineCommentDoc(Lexer *this)

{
  ulong uVar1;
  Lexer *in_RSI;
  bool bVar2;
  Lexer *this_local;
  
  nextChar(in_RSI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&in_RSI->lastComment,'\n');
  }
  while( true ) {
    bVar2 = false;
    if ((in_RSI->currentChar != -1) && (bVar2 = false, in_RSI->currentChar != 10)) {
      bVar2 = in_RSI->currentChar != 0xd;
    }
    if (!bVar2) break;
    std::__cxx11::string::operator+=((string *)&in_RSI->lastComment,(char)in_RSI->currentChar);
    nextChar(in_RSI);
  }
  nextToken(this);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextLineCommentDoc() noexcept {
  nextChar();
  if (!lastComment.empty())
    lastComment += '\n';

  while (currentChar != EOF && currentChar != '\n' && currentChar != '\r') {
    lastComment += (char) currentChar;
    nextChar();
  }

  return nextToken();
}